

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ReporterRegistry::registerReporter
          (ReporterRegistry *this,string *name,Ptr<Catch::IReporterFactory> *factory)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>
  local_40;
  
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>,_true>
            (&local_40,name,factory);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::Ptr<Catch::IReporterFactory>>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::Ptr<Catch::IReporterFactory>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::Ptr<Catch::IReporterFactory>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::Ptr<Catch::IReporterFactory>>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::Ptr<Catch::IReporterFactory>>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::Ptr<Catch::IReporterFactory>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::Ptr<Catch::IReporterFactory>>>>
              *)&this->m_factories,&local_40);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>
  ::~pair(&local_40);
  return;
}

Assistant:

void registerReporter( std::string const& name, Ptr<IReporterFactory> const& factory ) {
            m_factories.insert( std::make_pair( name, factory ) );
        }